

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

curl_sslbackend Curl_ssl_backend(void)

{
  multissl_setup((Curl_ssl *)0x0);
  return (Curl_ssl->info).id;
}

Assistant:

curl_sslbackend Curl_ssl_backend(void)
{
#ifdef USE_SSL
  multissl_setup(NULL);
  return Curl_ssl->info.id;
#else
  return CURLSSLBACKEND_NONE;
#endif
}